

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O2

element<tinyusdz::crate::CrateDataTypeId,_bool> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,bool>const*,mapbox::eternal::impl::compare_key<tinyusdz::crate::CrateDataTypeId>>
          (element<tinyusdz::crate::CrateDataTypeId,_bool> *left,
          element<tinyusdz::crate::CrateDataTypeId,_bool> *right,
          compare_key<tinyusdz::crate::CrateDataTypeId> *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (long)right - (long)left >> 3;
  while (uVar2 != 0) {
    uVar1 = uVar2 >> 1;
    uVar3 = ~uVar1 + uVar2;
    uVar2 = uVar1;
    if ((int)left[uVar1].pair.first < (int)key->key) {
      left = left + uVar1 + 1;
      uVar2 = uVar3;
    }
  }
  return left;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}